

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_opt0
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 ZSTD_dictMode_e dictMode)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  U32 UVar8;
  U32 rawStat;
  ZSTD_optimal_t sol;
  ZSTD_optimal_t sol_00;
  ZSTD_optimal_t sol_01;
  ZSTD_optimal_t sol_02;
  ZSTD_optimal_t sol_03;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int iVar15;
  U32 UVar16;
  U32 UVar17;
  U32 UVar18;
  int iVar19;
  BYTE *pBVar20;
  ZSTD_optimal_t *pZVar21;
  BYTE *in_RCX;
  ZSTD_optimal_t *pZVar22;
  U32 *in_RDX;
  long *in_RSI;
  ZSTD_matchState_t *in_RDI;
  long in_R8;
  repcodes_t rVar23;
  U32 advance;
  U32 offBase_1;
  U32 mlen_1;
  U32 llen;
  U32 storePos;
  U32 backDist;
  U32 seqPos;
  U32 storeStart;
  U32 storeEnd;
  repcodes_t reps;
  int price_2;
  U32 pos_1;
  U32 mlen;
  U32 startML;
  U32 lastML;
  U32 offset;
  U32 maxML_1;
  U32 matchNb_1;
  U32 nbMatches_1;
  U32 basePrice;
  U32 previousPrice;
  U32 litlen_2;
  U32 ll0_1;
  repcodes_t newReps;
  U32 prev;
  int price_1;
  U32 litlen_1;
  BYTE *inr;
  U32 sequencePrice;
  U32 matchPrice;
  U32 end;
  U32 offBase;
  U32 matchNb;
  U32 pos;
  U32 literalsPrice;
  U32 maxOffBase;
  U32 maxML;
  U32 i;
  U32 nbMatches;
  U32 ll0;
  U32 litlen;
  U32 last_pos;
  U32 cur;
  ZSTD_optLdm_t optLdm;
  ZSTD_optimal_t lastSequence;
  ZSTD_match_t *matches;
  ZSTD_optimal_t *opt;
  U32 nextToUpdate3;
  U32 minMatch;
  U32 sufficient_len;
  ZSTD_getAllMatchesFn getAllMatches;
  ZSTD_compressionParameters *cParams;
  BYTE *prefixStart;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  optState_t *optStatePtr;
  size_t mlBase_2;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  U32 mlCode;
  U32 mlBase;
  U32 offCode;
  U32 price;
  U32 mlCode_1;
  U32 mlBase_1;
  U32 offCode_1;
  U32 price_3;
  U32 in_stack_fffffffffffffc5c;
  U32 in_stack_fffffffffffffc64;
  U32 in_stack_fffffffffffffc68;
  U32 in_stack_fffffffffffffc6c;
  U32 in_stack_fffffffffffffc70;
  U32 in_stack_fffffffffffffc74;
  U32 in_stack_fffffffffffffc78;
  U32 in_stack_fffffffffffffc7c;
  uint in_stack_fffffffffffffc80;
  uint in_stack_fffffffffffffc84;
  U32 local_374;
  U32 local_368;
  U32 local_35c;
  uint local_354;
  U32 local_34c;
  U32 local_344;
  ZSTD_dictMode_e in_stack_fffffffffffffccc;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  U32 local_324;
  U32 local_318;
  uint local_310;
  uint local_2cc;
  uint local_2a4;
  uint local_2a0;
  undefined8 local_298;
  U32 local_290;
  uint local_274;
  uint local_260;
  undefined8 local_248;
  U32 local_240;
  uint local_204;
  uint local_200;
  uint local_1f0;
  uint local_1e0;
  uint local_1dc;
  undefined1 local_1d8 [4];
  int in_stack_fffffffffffffe2c;
  size_t in_stack_fffffffffffffe30;
  BYTE *in_stack_fffffffffffffe38;
  optState_t *in_stack_fffffffffffffe40;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  U32 local_188;
  ZSTD_match_t *local_180;
  ZSTD_optimal_t *local_178;
  U32 local_16c;
  U32 local_168;
  uint local_164;
  ZSTD_getAllMatchesFn local_160;
  ZSTD_compressionParameters *local_158;
  BYTE *local_150;
  BYTE *local_148;
  BYTE *local_140;
  BYTE *local_138;
  BYTE *local_130;
  BYTE *local_128;
  optState_t *local_118;
  int local_10c;
  U32 *local_f8;
  long *local_f0;
  ZSTD_matchState_t *local_e8;
  ulong local_e0;
  BYTE *local_d8;
  BYTE *local_d0;
  ulong local_c8;
  U32 local_bc;
  BYTE *local_b8;
  BYTE *local_b0;
  ulong local_a8;
  long *local_a0;
  void *local_98;
  void *local_90;
  BYTE *local_88;
  long local_80;
  undefined4 local_74;
  long local_70;
  BYTE *local_68;
  void *local_60;
  U32 local_54;
  int local_50;
  uint local_4c;
  int local_48;
  int local_44;
  optState_t *local_40;
  uint local_38;
  U32 local_34;
  int local_30;
  U32 local_2c;
  int local_28;
  uint local_24;
  int local_20;
  int local_1c;
  optState_t *local_18;
  uint local_c;
  U32 local_8;
  int local_4;
  
  local_10c = 0;
  local_118 = &in_RDI->opt;
  local_138 = in_RCX + in_R8;
  local_140 = local_138 + -8;
  local_148 = (in_RDI->window).base;
  local_150 = local_148 + (in_RDI->window).dictLimit;
  local_158 = &in_RDI->cParams;
  local_130 = in_RCX;
  local_128 = in_RCX;
  local_f8 = in_RDX;
  local_f0 = in_RSI;
  local_e8 = in_RDI;
  local_160 = ZSTD_selectBtGetAllMatches
                        ((ZSTD_matchState_t *)
                         CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                         in_stack_fffffffffffffccc);
  if (local_158->targetLength < 0xfff) {
    local_310 = local_158->targetLength;
  }
  else {
    local_310 = 0xfff;
  }
  local_164 = local_310;
  local_168 = 4;
  if (local_158->minMatch == 3) {
    local_168 = 3;
  }
  local_16c = local_e8->nextToUpdate;
  local_178 = local_118->priceTable;
  local_180 = local_118->matchTable;
  memset(&local_1a0,0,0x1c);
  if (local_e8->ldmSeqStore == (rawSeqStore_t *)0x0) {
    memcpy(local_1d8,&kNullRawSeqStore,0x28);
    UVar8 = in_stack_fffffffffffffc5c;
    rawStat = in_stack_fffffffffffffc64;
  }
  else {
    memcpy(local_1d8,local_e8->ldmSeqStore,0x28);
    UVar8 = in_stack_fffffffffffffc5c;
    rawStat = in_stack_fffffffffffffc64;
  }
  ZSTD_opt_getNextMatchAndUpdateSeqStore
            ((ZSTD_optLdm_t *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
             in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
  if (2 < local_10c) {
    __assert_fail("optLevel <= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x836e,
                  "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                 );
  }
  ZSTD_rescaleFreqs(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe2c);
  local_128 = local_128 + (int)(uint)(local_128 == local_150);
  do {
    while( true ) {
      if (local_140 <= local_128) {
        return (long)local_138 - (long)local_130;
      }
      local_344 = (int)local_128 - (int)local_130;
      uVar7._0_4_ = (uint)((local_344 != 0 ^ 0xffU) & 1);
      uVar6._4_4_ = local_168;
      uVar7._4_4_ = (*local_160)(local_180,local_e8,&local_16c,local_128,local_138,local_f8,
                                 (uint)uVar7,local_168);
      ZSTD_optLdm_processMatchCandidate
                ((ZSTD_optLdm_t *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 (ZSTD_match_t *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                 (U32 *)CONCAT44(rawStat,uVar6._4_4_),UVar8,(uint)uVar7);
      if (uVar7._4_4_ != 0) break;
      local_128 = local_128 + 1;
    }
    for (local_1f0 = 0; local_1f0 < 3; local_1f0 = local_1f0 + 1) {
      local_178->rep[local_1f0] = local_f8[local_1f0];
    }
    local_178->mlen = 0;
    local_178->litlen = local_344;
    uVar6._4_4_ = ZSTD_litLengthPrice(in_stack_fffffffffffffc70,
                                      (optState_t *)
                                      CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                                      rawStat);
    local_178->price = uVar6._4_4_;
    uVar7._0_4_ = local_180[uVar7._4_4_ - 1].len;
    uVar6._4_4_ = local_180[uVar7._4_4_ - 1].off;
    if (local_164 < (uint)uVar7) {
      local_198 = CONCAT44(local_344,(uint)uVar7);
      local_1a0 = CONCAT44(uVar6._4_4_,(undefined4)local_1a0);
      local_1dc = 0;
      in_stack_fffffffffffffc68 = (U32)local_190;
      in_stack_fffffffffffffc6c = (U32)((ulong)local_190 >> 0x20);
      sol.off = uVar6._4_4_;
      sol.price = (undefined4)local_1a0;
      sol.mlen = (uint)uVar7;
      sol.litlen = local_344;
      sol.rep[0] = in_stack_fffffffffffffc68;
      sol.rep[1] = in_stack_fffffffffffffc6c;
      sol.rep[2] = local_188;
      uVar6._0_4_ = (undefined4)local_1a0;
      in_stack_fffffffffffffc70 = local_188;
      ZSTD_totalLen(sol);
    }
    else {
      if (local_178->price < 0) {
        __assert_fail("opt[0].price >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x839b,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
      iVar19 = local_178->price;
      uVar6._4_4_ = ZSTD_litLengthPrice(in_stack_fffffffffffffc70,
                                        (optState_t *)
                                        CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68
                                                ),rawStat);
      for (local_200 = 1; local_200 < local_168; local_200 = local_200 + 1) {
        local_178[local_200].price = 0x40000000;
      }
      for (local_204 = 0; local_204 < uVar7._4_4_; local_204 = local_204 + 1) {
        UVar17 = local_180[local_204].off;
        uVar7._0_4_ = local_180[local_204].len;
        for (; local_200 <= (uint)uVar7; local_200 = local_200 + 1) {
          local_38 = local_200;
          local_40 = local_118;
          local_44 = local_10c;
          local_34 = UVar17;
          local_4c = ZSTD_highbit32(0);
          local_50 = local_38 - 3;
          if (local_38 < 3) {
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x806c,
                          "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                         );
          }
          if (local_40->priceType == zop_predef) {
            if (local_44 == 0) {
              local_318 = ZSTD_bitWeight(0);
            }
            else {
              local_318 = ZSTD_fracWeight(rawStat);
            }
            local_30 = local_318 + (local_4c + 0x10) * 0x100;
          }
          else {
            iVar15 = local_4c * 0x100;
            UVar18 = local_40->offCodeSumBasePrice;
            if (local_44 == 0) {
              local_324 = ZSTD_bitWeight(0);
            }
            else {
              local_324 = ZSTD_fracWeight(rawStat);
            }
            local_48 = iVar15 + (UVar18 - local_324);
            if ((local_44 < 2) && (0x13 < local_4c)) {
              local_48 = (local_4c - 0x13) * 0x200 + local_48;
            }
            local_54 = ZSTD_MLcode(0);
            iVar15 = (uint)""[local_54] << 8;
            UVar18 = local_40->matchLengthSumBasePrice;
            if (local_44 == 0) {
              UVar16 = ZSTD_bitWeight(0);
            }
            else {
              UVar16 = ZSTD_fracWeight(rawStat);
            }
            local_48 = iVar15 + (UVar18 - UVar16) + local_48 + 0x33;
            local_30 = local_48;
          }
          local_178[local_200].mlen = local_200;
          local_178[local_200].off = UVar17;
          local_178[local_200].litlen = local_344;
          local_178[local_200].price = iVar19 + uVar6._4_4_ + local_30;
        }
      }
      local_1e0 = local_200 - 1;
      for (local_1dc = 1; local_1dc <= local_1e0; local_1dc = local_1dc + 1) {
        pBVar20 = local_128 + local_1dc;
        if (0xfff < local_1dc) {
          __assert_fail("cur < ZSTD_OPT_NUM",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x83b6,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        if (local_178[local_1dc - 1].mlen == 0) {
          uVar6._4_4_ = local_178[local_1dc - 1].litlen + 1;
        }
        else {
          uVar6._4_4_ = 1;
        }
        iVar19 = local_178[local_1dc - 1].price;
        uVar7._4_4_ = ZSTD_rawLiteralsCost
                                ((BYTE *)CONCAT44(in_stack_fffffffffffffc7c,
                                                  in_stack_fffffffffffffc78),
                                 in_stack_fffffffffffffc74,
                                 (optState_t *)
                                 CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                                 rawStat);
        UVar17 = ZSTD_litLengthPrice(in_stack_fffffffffffffc70,
                                     (optState_t *)
                                     CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                                     rawStat);
        UVar18 = ZSTD_litLengthPrice(in_stack_fffffffffffffc70,
                                     (optState_t *)
                                     CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                                     rawStat);
        iVar19 = (iVar19 + uVar7._4_4_ + UVar17) - UVar18;
        if (999999999 < iVar19) {
          __assert_fail("price < 1000000000",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x83bf,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        if (iVar19 <= local_178[local_1dc].price) {
          local_178[local_1dc].mlen = 0;
          local_178[local_1dc].off = 0;
          local_178[local_1dc].litlen = uVar6._4_4_;
          local_178[local_1dc].price = iVar19;
        }
        if (local_1dc < local_178[local_1dc].mlen) {
          __assert_fail("cur >= opt[cur].mlen",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x83d5,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        if (local_178[local_1dc].mlen == 0) {
          *(undefined8 *)local_178[local_1dc].rep = *(undefined8 *)local_178[local_1dc - 1].rep;
          local_178[local_1dc].rep[2] = local_178[local_1dc - 1].rep[2];
        }
        else {
          rVar23 = ZSTD_newRep((U32 *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                               in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68);
          local_248 = rVar23.rep._0_8_;
          local_240 = rVar23.rep[2];
          *(undefined8 *)local_178[local_1dc].rep = local_248;
          local_178[local_1dc].rep[2] = local_240;
        }
        if (pBVar20 <= local_140) {
          if (local_1dc == local_1e0) break;
          if ((local_10c != 0) ||
             (local_178[local_1dc].price + 0x80 < local_178[local_1dc + 1].price)) {
            if (local_178[local_1dc].price < 0) {
              __assert_fail("opt[cur].price >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x83e9,
                            "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                           );
            }
            uVar7._0_4_ = (uint)(local_178[local_1dc].mlen != 0);
            if (local_178[local_1dc].mlen == 0) {
              local_344 = local_178[local_1dc].litlen;
            }
            else {
              local_344 = 0;
            }
            iVar19 = local_178[local_1dc].price;
            uVar7._4_4_ = ZSTD_litLengthPrice(in_stack_fffffffffffffc70,
                                              (optState_t *)
                                              CONCAT44(in_stack_fffffffffffffc6c,
                                                       in_stack_fffffffffffffc68),rawStat);
            uVar6._4_4_ = local_168;
            UVar17 = (*local_160)(local_180,local_e8,&local_16c,pBVar20,local_138,
                                  local_178[local_1dc].rep,(uint)uVar7,local_168);
            ZSTD_optLdm_processMatchCandidate
                      ((ZSTD_optLdm_t *)
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       (ZSTD_match_t *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68)
                       ,(U32 *)CONCAT44(rawStat,uVar6._4_4_),UVar8,(uint)uVar7);
            if (UVar17 != 0) {
              uVar7._0_4_ = local_180[UVar17 - 1].len;
              if ((local_164 < (uint)uVar7) || (0xfff < local_1dc + (uint)uVar7)) {
                uVar6._4_4_ = local_180[UVar17 - 1].off;
                local_1a0 = CONCAT44(uVar6._4_4_,(undefined4)local_1a0);
                local_198 = CONCAT44(local_344,(uint)uVar7);
                if (local_178[local_1dc].mlen == 0) {
                  local_34c = local_178[local_1dc].litlen;
                }
                else {
                  local_34c = 0;
                }
                local_1dc = local_1dc - local_34c;
                in_stack_fffffffffffffc68 = (U32)local_190;
                in_stack_fffffffffffffc6c = (U32)((ulong)local_190 >> 0x20);
                sol_00.off = uVar6._4_4_;
                sol_00.price = (undefined4)local_1a0;
                sol_00.mlen = (uint)uVar7;
                sol_00.litlen = local_344;
                sol_00.rep[0] = in_stack_fffffffffffffc68;
                sol_00.rep[1] = in_stack_fffffffffffffc6c;
                sol_00.rep[2] = local_188;
                uVar6._0_4_ = (undefined4)local_1a0;
                in_stack_fffffffffffffc70 = local_188;
                ZSTD_totalLen(sol_00);
                if (0x1000 < local_1dc) {
                  local_1dc = 0;
                }
                goto LAB_002ea3e9;
              }
              for (local_260 = 0; local_260 < UVar17; local_260 = local_260 + 1) {
                uVar6._4_4_ = local_180[local_260].off;
                local_274 = local_180[local_260].len;
                if (local_260 == 0) {
                  local_354 = local_168;
                }
                else {
                  local_354 = local_180[local_260 - 1].len + 1;
                }
                for (; local_354 <= local_274; local_274 = local_274 - 1) {
                  uVar7._0_4_ = local_1dc + local_274;
                  local_c = local_274;
                  local_18 = local_118;
                  local_1c = local_10c;
                  local_8 = uVar6._4_4_;
                  local_24 = ZSTD_highbit32(0);
                  local_28 = local_c - 3;
                  if (local_c < 3) {
                    __assert_fail("matchLength >= MINMATCH",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x806c,
                                  "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                                 );
                  }
                  if (local_18->priceType == zop_predef) {
                    if (local_1c == 0) {
                      local_35c = ZSTD_bitWeight(0);
                    }
                    else {
                      local_35c = ZSTD_fracWeight(rawStat);
                    }
                    local_4 = local_35c + (local_24 + 0x10) * 0x100;
                  }
                  else {
                    iVar15 = local_24 * 0x100;
                    UVar18 = local_18->offCodeSumBasePrice;
                    if (local_1c == 0) {
                      local_368 = ZSTD_bitWeight(0);
                    }
                    else {
                      local_368 = ZSTD_fracWeight(rawStat);
                    }
                    local_20 = iVar15 + (UVar18 - local_368);
                    if ((local_1c < 2) && (0x13 < local_24)) {
                      local_20 = (local_24 - 0x13) * 0x200 + local_20;
                    }
                    local_2c = ZSTD_MLcode(0);
                    bVar1 = ""[local_2c];
                    UVar18 = local_18->matchLengthSumBasePrice;
                    if (local_1c == 0) {
                      local_374 = ZSTD_bitWeight(0);
                    }
                    else {
                      local_374 = ZSTD_fracWeight(rawStat);
                    }
                    local_20 = (uint)bVar1 * 0x100 + (UVar18 - local_374) + local_20 + 0x33;
                    local_4 = local_20;
                  }
                  iVar15 = iVar19 + uVar7._4_4_ + local_4;
                  if ((local_1e0 < (uint)uVar7) || (iVar15 < local_178[(uint)uVar7].price)) {
                    for (; local_1e0 < (uint)uVar7; local_1e0 = local_1e0 + 1) {
                      local_178[local_1e0 + 1].price = 0x40000000;
                    }
                    local_178[(uint)uVar7].mlen = local_274;
                    local_178[(uint)uVar7].off = uVar6._4_4_;
                    local_178[(uint)uVar7].litlen = local_344;
                    local_178[(uint)uVar7].price = iVar15;
                  }
                  else if (local_10c == 0) break;
                }
              }
            }
          }
        }
      }
      pZVar21 = local_178 + local_1e0;
      uVar6._0_4_ = pZVar21->price;
      uVar6._4_4_ = pZVar21->off;
      uVar7._0_4_ = pZVar21->mlen;
      uVar7._4_4_ = pZVar21->litlen;
      uVar9 = pZVar21->price;
      uVar10 = pZVar21->off;
      uVar11 = pZVar21->mlen;
      sol_01.mlen = uVar11;
      sol_01.off = uVar10;
      sol_01.price = uVar9;
      local_190 = *(undefined8 *)pZVar21->rep;
      in_stack_fffffffffffffc70 = pZVar21->rep[2];
      in_stack_fffffffffffffc68 = (U32)local_190;
      in_stack_fffffffffffffc6c = (U32)((ulong)local_190 >> 0x20);
      sol_01.litlen = uVar7._4_4_;
      sol_01.rep[0] = in_stack_fffffffffffffc68;
      sol_01.rep[1] = in_stack_fffffffffffffc6c;
      sol_01.rep[2] = in_stack_fffffffffffffc70;
      local_1a0 = uVar6;
      local_198 = uVar7;
      local_188 = in_stack_fffffffffffffc70;
      UVar8 = ZSTD_totalLen(sol_01);
      if (UVar8 < local_1e0) {
        uVar6._0_4_ = (undefined4)local_1a0;
        uVar6._4_4_ = (U32)((ulong)local_1a0 >> 0x20);
        uVar7._0_4_ = (uint)local_198;
        local_344 = (U32)((ulong)local_198 >> 0x20);
        in_stack_fffffffffffffc68 = (U32)local_190;
        in_stack_fffffffffffffc6c = (U32)((ulong)local_190 >> 0x20);
        sol_02.mlen = (uint)uVar7;
        sol_02.price = (undefined4)local_1a0;
        sol_02.off = local_1a0._4_4_;
        sol_02.litlen = local_344;
        sol_02.rep[0] = in_stack_fffffffffffffc68;
        sol_02.rep[1] = in_stack_fffffffffffffc6c;
        sol_02.rep[2] = local_188;
        in_stack_fffffffffffffc70 = local_188;
        UVar8 = ZSTD_totalLen(sol_02);
        in_stack_fffffffffffffc84 = local_1e0 - UVar8;
        in_stack_fffffffffffffc80 = local_1e0;
      }
      else {
        in_stack_fffffffffffffc84 = 0;
        local_344 = uVar7._4_4_;
      }
      local_1dc = in_stack_fffffffffffffc84;
      if (0xfff < in_stack_fffffffffffffc84) {
        __assert_fail("cur < ZSTD_OPT_NUM",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8428,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
    }
LAB_002ea3e9:
    if (local_178->mlen != 0) {
      __assert_fail("opt[0].mlen == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x842b,
                    "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                   );
    }
    if ((int)local_198 == 0) {
      *(undefined8 *)local_f8 = *(undefined8 *)local_178[local_1dc].rep;
      local_f8[2] = local_178[local_1dc].rep[2];
      uVar4 = (undefined4)uVar6;
      UVar8 = uVar6._4_4_;
      uVar5 = (uint)uVar7;
      rawStat = local_344;
    }
    else {
      rVar23 = ZSTD_newRep((U32 *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                           in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68);
      local_298 = rVar23.rep._0_8_;
      local_290 = rVar23.rep[2];
      *(undefined8 *)local_f8 = local_298;
      local_f8[2] = local_290;
      uVar4 = (undefined4)uVar6;
      UVar8 = uVar6._4_4_;
      uVar5 = (uint)uVar7;
      rawStat = local_344;
    }
    uVar7._0_4_ = local_1dc + 1;
    local_2a4 = local_1dc;
    if (0xfff < (uint)uVar7) {
      __assert_fail("storeEnd < ZSTD_OPT_NUM",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x843e,
                    "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                   );
    }
    pZVar21 = local_178 + (uint)uVar7;
    pZVar21->price = (undefined4)local_1a0;
    pZVar21->off = local_1a0._4_4_;
    pZVar21->mlen = (int)local_198;
    pZVar21->litlen = local_198._4_4_;
    *(undefined8 *)pZVar21->rep = local_190;
    pZVar21->rep[2] = local_188;
    local_2a0 = (uint)uVar7;
    while (local_2a4 != 0) {
      pZVar21 = local_178 + local_2a4;
      uVar4 = pZVar21->price;
      UVar8 = pZVar21->off;
      uVar5 = pZVar21->mlen;
      rawStat = pZVar21->litlen;
      uVar12 = pZVar21->price;
      uVar13 = pZVar21->off;
      uVar14 = pZVar21->mlen;
      sol_03.mlen = uVar14;
      sol_03.off = uVar13;
      sol_03.price = uVar12;
      in_stack_fffffffffffffc70 = pZVar21->rep[2];
      in_stack_fffffffffffffc68 = (U32)*(undefined8 *)pZVar21->rep;
      in_stack_fffffffffffffc6c = (U32)((ulong)*(undefined8 *)pZVar21->rep >> 0x20);
      sol_03.litlen = rawStat;
      sol_03.rep[0] = in_stack_fffffffffffffc68;
      sol_03.rep[1] = in_stack_fffffffffffffc6c;
      sol_03.rep[2] = in_stack_fffffffffffffc70;
      in_stack_fffffffffffffc7c = ZSTD_totalLen(sol_03);
      local_2a0 = local_2a0 - 1;
      pZVar21 = local_178 + local_2a0;
      pZVar22 = local_178 + local_2a4;
      uVar6._4_4_ = pZVar22->off;
      pZVar21->price = pZVar22->price;
      pZVar21->off = uVar6._4_4_;
      uVar6._4_4_ = pZVar22->litlen;
      pZVar21->mlen = pZVar22->mlen;
      pZVar21->litlen = uVar6._4_4_;
      *(undefined8 *)pZVar21->rep = *(undefined8 *)pZVar22->rep;
      pZVar21->rep[2] = pZVar22->rep[2];
      if (in_stack_fffffffffffffc7c < local_2a4) {
        in_stack_fffffffffffffc7c = local_2a4 - in_stack_fffffffffffffc7c;
        local_2a4 = in_stack_fffffffffffffc7c;
      }
      else {
        in_stack_fffffffffffffc7c = 0;
        local_2a4 = in_stack_fffffffffffffc7c;
      }
    }
    for (local_2cc = local_2a0; local_2cc <= (uint)uVar7; local_2cc = local_2cc + 1) {
      uVar2 = local_178[local_2cc].litlen;
      uVar3 = local_178[local_2cc].mlen;
      uVar6._4_4_ = local_178[local_2cc].off;
      if (uVar3 == 0) {
        if (local_2cc != (uint)uVar7) {
          __assert_fail("storePos == storeEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8457,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        local_128 = local_130 + uVar2;
      }
      else {
        if (local_138 < local_130 + uVar2) {
          __assert_fail("anchor + llen <= iend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x845c,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        ZSTD_updateStats((optState_t *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)
                         ,in_stack_fffffffffffffc7c,
                         (BYTE *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68);
        local_a8 = (ulong)uVar2;
        local_c8 = (ulong)uVar3;
        local_a0 = local_f0;
        local_b0 = local_130;
        local_b8 = local_138;
        local_d0 = local_138 + -0x20;
        local_d8 = local_130 + local_a8;
        local_bc = uVar6._4_4_;
        if ((ulong)local_f0[7] <= (ulong)(local_f0[1] - *local_f0 >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < (ulong)local_f0[8]) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if ((ulong)(local_f0[2] + local_f0[8]) < local_f0[3] + local_a8) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_138 < local_130 + local_a8) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_d0 < local_d8) {
          ZSTD_safecopyLiterals
                    ((BYTE *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     (BYTE *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                     (BYTE *)CONCAT44(rawStat,uVar5),(BYTE *)CONCAT44(UVar8,uVar4));
        }
        else {
          ZSTD_copy16((void *)local_f0[3],local_130);
          if (0x10 < local_a8) {
            local_90 = (void *)(local_a0[3] + 0x10);
            local_88 = local_b0 + 0x10;
            local_70 = local_a8 - 0x10;
            local_74 = 0;
            local_80 = (long)local_90 - (long)local_88;
            local_98 = (void *)((long)local_90 + local_70);
            local_68 = local_88;
            local_60 = local_90;
            if ((local_80 < 0x10) && (-0x10 < local_80)) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(local_90,local_88);
            if (0x10 < local_70) {
              local_90 = (void *)((long)local_90 + 0x10);
              local_88 = local_88 + 0x10;
              do {
                ZSTD_copy16(local_90,local_88);
                local_90 = (void *)((long)local_90 + 0x10);
                local_88 = local_88 + 0x10;
                ZSTD_copy16(local_90,local_88);
                local_90 = (void *)((long)local_90 + 0x10);
                local_88 = local_88 + 0x10;
              } while (local_90 < local_98);
            }
          }
        }
        local_a0[3] = local_a8 + local_a0[3];
        if (0xffff < local_a8) {
          if ((int)local_a0[9] != 0) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          *(undefined4 *)(local_a0 + 9) = 1;
          *(int *)((long)local_a0 + 0x4c) = (int)(local_a0[1] - *local_a0 >> 3);
        }
        *(short *)(local_a0[1] + 4) = (short)local_a8;
        *(U32 *)local_a0[1] = local_bc;
        if (local_c8 < 3) {
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_e0 = local_c8 - 3;
        if (0xffff < local_e0) {
          if ((int)local_a0[9] != 0) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          *(undefined4 *)(local_a0 + 9) = 2;
          *(int *)((long)local_a0 + 0x4c) = (int)(local_a0[1] - *local_a0 >> 3);
        }
        *(short *)(local_a0[1] + 6) = (short)local_e0;
        local_a0[1] = local_a0[1] + 8;
        local_130 = local_130 + (uVar2 + uVar3);
        local_128 = local_130;
      }
    }
    ZSTD_setBasePrices((optState_t *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       in_stack_fffffffffffffc6c);
  } while( true );
}

Assistant:

static size_t ZSTD_compressBlock_opt0(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize, const ZSTD_dictMode_e dictMode)
{
    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 0 /* optLevel */, dictMode);
}